

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

GCRef * gc_sweep(global_State *g,GCRef *p,uint32_t lim)

{
  byte bVar1;
  uint uVar2;
  GCobj *pGVar3;
  int iVar4;
  
  uVar2 = p->gcptr32;
  if (uVar2 != 0) {
    bVar1 = (g->gc).currentwhite;
    iVar4 = lim + 1;
    do {
      pGVar3 = (GCobj *)(ulong)uVar2;
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        return (GCRef *)(GCobj *)p;
      }
      if ((pGVar3->gch).gct == '\x06') {
        gc_sweep(g,(GCRef *)((long)pGVar3 + 0x28),0x7fffff00);
      }
      if ((byte)((*(byte *)((long)pGVar3 + 4) ^ 3) & (bVar1 ^ 3)) == 0) {
        (((GChead *)p)->nextgc).gcptr32 = (pGVar3->gch).nextgc.gcptr32;
        if (uVar2 == (g->gc).root.gcptr32) {
          (g->gc).root.gcptr32 = (pGVar3->gch).nextgc.gcptr32;
        }
        (*gc_freefunc[(pGVar3->gch).gct - 4])(g,pGVar3);
      }
      else {
        *(byte *)((long)pGVar3 + 4) = (g->gc).currentwhite & 3 | *(byte *)((long)pGVar3 + 4) & 0xf8;
        p = (GCRef *)pGVar3;
      }
      uVar2 = (((GChead *)p)->nextgc).gcptr32;
    } while (uVar2 != 0);
  }
  return (GCRef *)(GCobj *)p;
}

Assistant:

static GCRef *gc_sweep(global_State *g, GCRef *p, uint32_t lim)
{
  /* Mask with other white and LJ_GC_FIXED. Or LJ_GC_SFIXED on shutdown. */
  int ow = otherwhite(g);
  GCobj *o;
  while ((o = gcref(*p)) != NULL && lim-- > 0) {
    if (o->gch.gct == ~LJ_TTHREAD)  /* Need to sweep open upvalues, too. */
      gc_fullsweep(g, &gco2th(o)->openupval);
    if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* Black or current white? */
      lua_assert(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED));
      makewhite(g, o);  /* Value is alive, change to the current white. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise value is dead, free it. */
      lua_assert(isdead(g, o) || ow == LJ_GC_SFIXED);
      setgcrefr(*p, o->gch.nextgc);
      if (o == gcref(g->gc.root))
	setgcrefr(g->gc.root, o->gch.nextgc);  /* Adjust list anchor. */
      gc_freefunc[o->gch.gct - ~LJ_TSTR](g, o);
    }
  }
  return p;
}